

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O1

void __thiscall
mp::NLFeeder_Easy::
FeedObjExpression<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ExprArgWriter>
          (NLFeeder_Easy *this,int param_1,ExprArgWriter *ew)

{
  File *f;
  double dVar1;
  int iVar2;
  size_t sVar3;
  size_t *psVar4;
  int *piVar5;
  double *pdVar6;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this_00;
  char **ppcVar7;
  long lVar8;
  int n2write;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  
  sVar3 = (this->nlme_).Q_.num_nz_;
  dVar1 = (this->nlme_).obj_c0_;
  if (sVar3 == 0) {
    ew->nargs_ = ew->nargs_ + -1;
    BinaryFormatter::nput(&ew->nlw_->super_FormatterType,&ew->nlw_->nm,dVar1);
    return;
  }
  psVar4 = (this->nlme_).Q_.start_;
  piVar5 = (this->nlme_).Q_.index_;
  pdVar6 = (this->nlme_).Q_.value_;
  ew->nargs_ = ew->nargs_ + -1;
  this_00 = ew->nlw_;
  f = &this_00->nm;
  BinaryFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",0x36,"sum");
  BinaryFormatter::apr
            (&this_00->super_FormatterType,f,"%d\n",(ulong)((int)sVar3 + (uint)(dVar1 != 0.0)));
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    BinaryFormatter::nput(&this_00->super_FormatterType,f,dVar1);
  }
  lVar11 = (long)(this->nlme_).vars_.num_col_;
  while (lVar11 != 0) {
    lVar8 = lVar11 + -1;
    lVar11 = lVar11 + -1;
    for (sVar10 = psVar4[lVar8]; sVar10 != sVar3; sVar10 = sVar10 + 1) {
      dVar1 = pdVar6[sVar10];
      BinaryFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",2,"*");
      BinaryFormatter::nput(&this_00->super_FormatterType,f,dVar1 * 0.5);
      BinaryFormatter::apr(&this_00->super_FormatterType,f,"o%d\t#%s\n",2,"*");
      ppcVar7 = (this->nlme_).var_names_;
      pcVar9 = "";
      if (ppcVar7 != (char **)0x0) {
        pcVar9 = ppcVar7[lVar11];
      }
      BinaryFormatter::apr
                (&this_00->super_FormatterType,f,"v%d\t#%s\n",
                 (ulong)(uint)(this->var_perm_).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar11].first,pcVar9);
      iVar2 = piVar5[sVar10];
      ppcVar7 = (this->nlme_).var_names_;
      pcVar9 = "";
      if (ppcVar7 != (char **)0x0) {
        pcVar9 = ppcVar7[iVar2];
      }
      BinaryFormatter::apr
                (&this_00->super_FormatterType,f,"v%d\t#%s\n",
                 (ulong)(uint)(this->var_perm_).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar2].first,pcVar9);
    }
    sVar3 = psVar4[lVar11];
  }
  return;
}

Assistant:

NLW2_SparseMatrix_C Hessian() const { return Q_; }